

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O2

void __thiscall CT::AllScans(CT *this)

{
  uint *puVar1;
  char cVar2;
  Mat1i *pMVar3;
  Mat1b *pMVar4;
  int r;
  uint i_label;
  int c;
  bool b_external;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar7 = 0;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  do {
    if (*(int *)&pMVar4->field_0x8 <= lVar7) {
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      for (lVar7 = 0; lVar7 < *(int *)&pMVar3->field_0x8; lVar7 = lVar7 + 1) {
        lVar5 = **(long **)&pMVar3->field_0x48 * lVar7 + *(long *)&pMVar3->field_0x10;
        for (lVar6 = 0; lVar6 < *(int *)&pMVar3->field_0xc; lVar6 = lVar6 + 1) {
          if (*(int *)(lVar5 + lVar6 * 4) == -1) {
            *(undefined4 *)(lVar5 + lVar6 * 4) = 0;
          }
        }
      }
      puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
      *puVar1 = *puVar1 + 1;
      return;
    }
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar5 = **(long **)&pMVar3->field_0x48 * lVar7 + *(long *)&pMVar3->field_0x10;
    lVar6 = **(long **)&pMVar4->field_0x48 * lVar7 + *(long *)&pMVar4->field_0x10;
    for (lVar8 = 0; lVar8 < *(int *)&pMVar4->field_0xc; lVar8 = lVar8 + 1) {
      cVar2 = *(char *)(lVar6 + lVar8);
      if (cVar2 == (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
        i_label = *(uint *)(lVar5 + lVar8 * 4);
        if ((i_label == 0) && ((lVar8 == 0 || (*(char *)(lVar6 + -1 + lVar8) != cVar2)))) {
          i_label = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
          (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = i_label;
          b_external = true;
        }
        else {
          if ((((long)*(int *)&pMVar4->field_0xc + -1 <= lVar8) ||
              (*(char *)(lVar6 + 1 + lVar8) == cVar2)) || (*(int *)(lVar5 + 4 + lVar8 * 4) == -1)) {
            if (i_label == 0) {
              *(undefined4 *)(lVar5 + lVar8 * 4) = *(undefined4 *)(lVar5 + -4 + lVar8 * 4);
            }
            goto LAB_0017ef36;
          }
          if (i_label == 0) {
            i_label = *(uint *)(lVar5 + -4 + lVar8 * 4);
          }
          b_external = false;
        }
        ContourTracing(this,(int)lVar8,(int)lVar7,i_label,b_external);
      }
LAB_0017ef36:
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void AllScans()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        n_labels_ = 0;
        for (int y = 0; y < img_.rows; y++) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_out_row = img_labels_.ptr<unsigned int>(y);
            for (int x = 0; x < img_.cols; x++) {

                if (img_row[x] == byF) {
                    // Case 1
                    if (img_labels_out_row[x] == 0 && (x == 0 || img_row[x - 1] != byF)) {
                        n_labels_++;
                        ContourTracing(x, y, n_labels_, true);
                        continue;
                    }
                    // Case 2
                    else if (x < img_.cols - 1 && img_row[x + 1] != byF && img_labels_out_row[x + 1] != -1) {
                        if (img_labels_out_row[x] == 0) {
                            // Current pixel unlabeled
                            // Assing label of left pixel
                            ContourTracing(x, y, img_labels_out_row[x - 1], false);
                        }
                        else {
                            ContourTracing(x, y, img_labels_out_row[x], false);
                        }
                        continue;
                    }
                    // case 3
                    else if (img_labels_out_row[x] == 0) {
                        img_labels_out_row[x] = img_labels_out_row[x - 1];
                    }
                }
            }
        }

        // Reassign to contour background value (0)
        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            for (int c = 0; c < img_labels_.cols; ++c) {
                if (img_labels_row[c] == -1)
                    img_labels_row[c] = 0;
            }
        }

        n_labels_++; // To count also background label
    }